

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O2

void Kit_SopDivideInternal
               (Kit_Sop_t *cSop,Kit_Sop_t *cDiv,Kit_Sop_t *vQuo,Kit_Sop_t *vRem,Vec_Int_t *vMemory)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint *puVar7;
  uint *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  
  if (cSop->nCubes < cDiv->nCubes) {
    __assert_fail("Kit_SopCubeNum(cSop) >= Kit_SopCubeNum(cDiv)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitSop.c"
                  ,0xb8,
                  "void Kit_SopDivideInternal(Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Vec_Int_t *)"
                 );
  }
  if (cDiv->nCubes == 1) {
    Kit_SopDivideByCube(cSop,cDiv,vQuo,vRem,vMemory);
    return;
  }
  vQuo->nCubes = 0;
  puVar8 = Vec_IntFetch(vMemory,cSop->nCubes / cDiv->nCubes);
  vQuo->pCubes = puVar8;
  lVar12 = 0;
  while( true ) {
    uVar1 = cSop->nCubes;
    if ((int)uVar1 <= lVar12) break;
    puVar7 = cSop->pCubes;
    uVar2 = puVar7[lVar12];
    if (uVar2 == 0) break;
    if (-1 < (int)uVar2) {
      uVar3 = cDiv->nCubes;
      uVar15 = 0;
      if (0 < (int)uVar3) {
        uVar15 = (ulong)uVar3;
      }
      uVar14 = 0xffffffff;
      for (uVar10 = 0; uVar11 = uVar15, uVar15 != uVar10; uVar10 = uVar10 + 1) {
        uVar14 = cDiv->pCubes[uVar10];
        uVar11 = uVar10;
        if (uVar14 == 0) {
          uVar14 = 0;
          break;
        }
        if ((uVar14 & ~uVar2) == 0) break;
      }
      if ((uint)uVar11 != uVar3) {
        uVar14 = ~uVar14 & uVar2;
        for (uVar10 = 0; uVar10 != uVar15; uVar10 = uVar10 + 1) {
          uVar4 = cDiv->pCubes[uVar10];
          if (uVar4 == 0) {
LAB_004d0fca:
            uVar15 = uVar10 & 0xffffffff;
            break;
          }
          if (uVar10 != (uVar11 & 0xffffffff)) {
            uVar9 = 0;
            while( true ) {
              if (uVar1 == uVar9) {
                uVar15 = uVar10 & 0xffffffff;
                goto LAB_004d0f28;
              }
              uVar5 = puVar7[uVar9];
              if ((uVar5 == 0) ||
                 (((-1 < (int)uVar5 && ((uVar5 & uVar4) == uVar4)) && (uVar14 == (uVar5 & ~uVar4))))
                 ) break;
              uVar9 = uVar9 + 1;
            }
            if (uVar1 == (uint)uVar9) goto LAB_004d0fca;
          }
        }
LAB_004d0f28:
        if ((uint)uVar15 == uVar3) {
          iVar13 = vQuo->nCubes;
          vQuo->nCubes = iVar13 + 1;
          puVar8[iVar13] = uVar14;
          puVar7[lVar12] = uVar2 | 0x80000000;
          for (uVar15 = 0;
              ((long)uVar15 < (long)cDiv->nCubes && (uVar1 = cDiv->pCubes[uVar15], uVar1 != 0));
              uVar15 = uVar15 + 1) {
            if (uVar15 != (uVar11 & 0xffffffff)) {
              uVar10 = (ulong)(uint)cSop->nCubes;
              if (cSop->nCubes < 1) {
                uVar10 = 0;
              }
              uVar9 = 0;
              while( true ) {
                if (uVar10 == uVar9) {
                  __assert_fail("i2 < Kit_SopCubeNum(cSop)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitSop.c"
                                ,0xfe,
                                "void Kit_SopDivideInternal(Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Vec_Int_t *)"
                               );
                }
                uVar2 = puVar7[uVar9];
                if ((uVar2 == 0) ||
                   (((-1 < (int)uVar2 && ((uVar2 & uVar1) == uVar1)) && (uVar14 == (uVar2 & ~uVar1))
                    ))) break;
                uVar9 = uVar9 + 1;
              }
              puVar7[uVar9] = uVar2 | 0x80000000;
            }
          }
        }
      }
    }
    lVar12 = lVar12 + 1;
  }
  iVar13 = uVar1 - cDiv->nCubes * vQuo->nCubes;
  vRem->nCubes = 0;
  puVar8 = Vec_IntFetch(vMemory,iVar13);
  vRem->pCubes = puVar8;
  for (lVar12 = 0; lVar12 < cSop->nCubes; lVar12 = lVar12 + 1) {
    uVar1 = cSop->pCubes[lVar12];
    if (uVar1 == 0) break;
    if ((int)uVar1 < 0) {
      cSop->pCubes[lVar12] = uVar1 & 0x7fffffff;
    }
    else {
      iVar6 = vRem->nCubes;
      vRem->nCubes = iVar6 + 1;
      puVar8[iVar6] = uVar1;
    }
  }
  if (iVar13 != vRem->nCubes) {
    __assert_fail("nCubesRem == Kit_SopCubeNum(vRem)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitSop.c"
                  ,0x114,
                  "void Kit_SopDivideInternal(Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Vec_Int_t *)"
                 );
  }
  return;
}

Assistant:

void Kit_SopDivideInternal( Kit_Sop_t * cSop, Kit_Sop_t * cDiv, Kit_Sop_t * vQuo, Kit_Sop_t * vRem, Vec_Int_t * vMemory )
{
    unsigned uCube, uDiv;
    unsigned uCube2 = 0; // Suppress "might be used uninitialized"
    unsigned uDiv2, uQuo;
    int i, i2, k, k2, nCubesRem;
    assert( Kit_SopCubeNum(cSop) >= Kit_SopCubeNum(cDiv) );
    // consider special case
    if ( Kit_SopCubeNum(cDiv) == 1 )
    {
        Kit_SopDivideByCube( cSop, cDiv, vQuo, vRem, vMemory );
        return;
    }
    // allocate quotient
    vQuo->nCubes = 0;
    vQuo->pCubes = Vec_IntFetch( vMemory, Kit_SopCubeNum(cSop) / Kit_SopCubeNum(cDiv) );
    // for each cube of the cover
    // it either belongs to the quotient or to the remainder
    Kit_SopForEachCube( cSop, uCube, i )
    {
        // skip taken cubes
        if ( Kit_CubeIsMarked(uCube) )
            continue;
        // find a matching cube in the divisor
        uDiv = ~0;
        Kit_SopForEachCube( cDiv, uDiv, k )
            if ( Kit_CubeContains( uCube, uDiv ) )
                break;
        // the cube is not found 
        if ( k == Kit_SopCubeNum(cDiv) )
            continue;
        // the quotient cube exists
        uQuo = Kit_CubeSharp( uCube, uDiv );
        // find corresponding cubes for other cubes of the divisor
        uDiv2 = ~0;
        Kit_SopForEachCube( cDiv, uDiv2, k2 )
        {
            if ( k2 == k )
                continue;
            // find a matching cube
            Kit_SopForEachCube( cSop, uCube2, i2 )
            {
                // skip taken cubes
                if ( Kit_CubeIsMarked(uCube2) )
                    continue;
                // check if the cube can be used
                if ( Kit_CubeContains( uCube2, uDiv2 ) && uQuo == Kit_CubeSharp( uCube2, uDiv2 ) )
                    break;
            }
            // the case when the cube is not found
            if ( i2 == Kit_SopCubeNum(cSop) )
                break;
        }
        // we did not find some cubes - continue looking at other cubes
        if ( k2 != Kit_SopCubeNum(cDiv) )
            continue;
        // we found all cubes - add the quotient cube
        Kit_SopPushCube( vQuo, uQuo );

        // mark the first cube
        Kit_SopWriteCube( cSop, Kit_CubeMark(uCube), i );
        // mark other cubes that have this quotient
        Kit_SopForEachCube( cDiv, uDiv2, k2 )
        {
            if ( k2 == k )
                continue;
            // find a matching cube
            Kit_SopForEachCube( cSop, uCube2, i2 )
            {
                // skip taken cubes
                if ( Kit_CubeIsMarked(uCube2) )
                    continue;
                // check if the cube can be used
                if ( Kit_CubeContains( uCube2, uDiv2 ) && uQuo == Kit_CubeSharp( uCube2, uDiv2 ) )
                    break;
            }
            assert( i2 < Kit_SopCubeNum(cSop) );
            // the cube is found, mark it 
            // (later we will add all unmarked cubes to the remainder)
            Kit_SopWriteCube( cSop, Kit_CubeMark(uCube2), i2 );
        }
    }
    // determine the number of cubes in the remainder
    nCubesRem = Kit_SopCubeNum(cSop) - Kit_SopCubeNum(vQuo) * Kit_SopCubeNum(cDiv);
    // allocate remainder
    vRem->nCubes = 0;
    vRem->pCubes = Vec_IntFetch( vMemory, nCubesRem );
    // finally add the remaining unmarked cubes to the remainder 
    // and clean the marked cubes in the cover
    Kit_SopForEachCube( cSop, uCube, i )
    {
        if ( !Kit_CubeIsMarked(uCube) )
        {
            Kit_SopPushCube( vRem, uCube );
            continue;
        }
        Kit_SopWriteCube( cSop, Kit_CubeUnmark(uCube), i );
    }
    assert( nCubesRem == Kit_SopCubeNum(vRem) );
}